

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O3

aom_codec_err_t
av1_copy_new_frame_dec(AV1_COMMON *cm,YV12_BUFFER_CONFIG *new_frame,YV12_BUFFER_CONFIG *sd)

{
  int iVar1;
  
  iVar1 = equal_dimensions_and_border(new_frame,sd);
  if (iVar1 == 0) {
    aom_internal_error(cm->error,AOM_CODEC_ERROR,"Incorrect buffer dimensions");
  }
  else {
    aom_yv12_copy_frame_c(new_frame,sd,(uint)(cm->seq_params->monochrome == '\0') * 2 + 1);
  }
  return cm->error->error_code;
}

Assistant:

aom_codec_err_t av1_copy_new_frame_dec(AV1_COMMON *cm,
                                       YV12_BUFFER_CONFIG *new_frame,
                                       YV12_BUFFER_CONFIG *sd) {
  const int num_planes = av1_num_planes(cm);

  if (!equal_dimensions_and_border(new_frame, sd))
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "Incorrect buffer dimensions");
  else
    aom_yv12_copy_frame(new_frame, sd, num_planes);

  return cm->error->error_code;
}